

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O2

fdtd3D * init_fdtd_3D_cpml(fdtd3D *__return_storage_ptr__,float_type *domain_size,float_type Sc,
                          float_type smallest_wavelength,border_condition *borders,
                          uintmax_t cpml_thickness)

{
  double dVar1;
  undefined1 auVar2 [16];
  border_condition bVar3;
  border_condition bVar4;
  uintmax_t uVar5;
  void *pvVar6;
  float_type *pfVar7;
  uintmax_t d;
  long lVar8;
  long lVar9;
  void *dist_from_border;
  size_t sVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  double dVar13;
  float_type fVar14;
  undefined1 auVar15 [16];
  uintmax_t uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  
  dVar18 = smallest_wavelength / 20.0;
  dVar13 = (dVar18 * Sc) / 299792458.0;
  auVar17._8_8_ = dVar18;
  auVar17._0_8_ = dVar18;
  auVar17 = vdivpd_avx(*(undefined1 (*) [16])domain_size,auVar17);
  auVar17 = vroundpd_avx(auVar17,10);
  auVar12 = vcvttpd2uqq_avx512vl(auVar17);
  auVar15._0_8_ = domain_size[2] / dVar18;
  auVar15._8_8_ = 0;
  auVar15 = vroundsd_avx(auVar15,auVar15,10);
  uVar5 = vcvttsd2usi_avx512f(auVar15);
  if (0.5773502691896258 < Sc) {
    fprintf(_stderr,
            "The value of Sc is too high, the simulation may be unstable. Please use a value lesser or equal to %.5f\n"
            ,0x3fe279a74590331d);
  }
  lVar8 = vpextrq_avx(auVar12,1);
  uVar16 = auVar12._0_8_;
  __return_storage_ptr__->dx = dVar18;
  __return_storage_ptr__->dy = dVar18;
  __return_storage_ptr__->dz = dVar18;
  __return_storage_ptr__->dt = dVar13;
  lVar9 = lVar8 * uVar16;
  sVar10 = uVar5 * lVar9 * 8;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->hx = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->hy = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->hz = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->ex = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->ey = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->ez = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->permittivity_inv = pvVar6;
  pvVar6 = calloc(1,sVar10);
  __return_storage_ptr__->permeability_inv = pvVar6;
  __return_storage_ptr__->psi_ey_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_ey_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_ey_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_ey_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_hx_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_hx_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_hx_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_hx_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_hy_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_hy_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_hy_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_hy_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_hz_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_hz_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_hz_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_hz_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_ex_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ex_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_ex_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_ex_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[1] = (void *)0x0;
  __return_storage_ptr__->bx = (float_type *)0x0;
  __return_storage_ptr__->by = (float_type *)0x0;
  __return_storage_ptr__->bz = (float_type *)0x0;
  __return_storage_ptr__->cx = (float_type *)0x0;
  __return_storage_ptr__->cy = (float_type *)0x0;
  __return_storage_ptr__->cz = (float_type *)0x0;
  __return_storage_ptr__->cpml_thickness = cpml_thickness;
  auVar2 = *(undefined1 (*) [16])borders;
  *(undefined1 (*) [16])__return_storage_ptr__->border_condition = auVar2;
  bVar3 = borders[4];
  __return_storage_ptr__->border_condition[4] = bVar3;
  bVar4 = borders[5];
  __return_storage_ptr__->border_condition[5] = bVar4;
  fVar14 = domain_size[1];
  __return_storage_ptr__->domain_size[0] = *domain_size;
  __return_storage_ptr__->domain_size[1] = fVar14;
  __return_storage_ptr__->domain_size[2] = domain_size[2];
  __return_storage_ptr__->sizeX = uVar16;
  __return_storage_ptr__->sizeY = auVar12._8_8_;
  __return_storage_ptr__->sizeZ = uVar5;
  __return_storage_ptr__->Sc = Sc;
  __return_storage_ptr__->num_Jsources = 0;
  __return_storage_ptr__->num_Msources = 0;
  __return_storage_ptr__->time = 0.0;
  auVar12 = ZEXT816(0) << 0x20;
  __return_storage_ptr__->Jsources = (fdtd_source *)auVar12._0_8_;
  __return_storage_ptr__->JsourceLocations = (void *)auVar12._8_8_;
  __return_storage_ptr__->Msources = (fdtd_source *)auVar12._0_8_;
  __return_storage_ptr__->MsourceLocations = (void *)auVar12._8_8_;
  if (cpml_thickness != 0) {
    if ((auVar2 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      sVar10 = cpml_thickness * lVar9 * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hx_z[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hy_z[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ex_z[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ey_z[0] = pvVar6;
    }
    if ((auVar2 & (undefined1  [16])0x400000000) != (undefined1  [16])0x0) {
      sVar10 = lVar9 * cpml_thickness * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hx_z[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hy_z[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ex_z[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ey_z[1] = pvVar6;
    }
    if ((auVar2 & (undefined1  [16])0x400000000) != (undefined1  [16])0x0) {
      sVar10 = uVar5 * cpml_thickness * lVar8 * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hy_x[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hz_x[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ey_x[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ez_x[0] = pvVar6;
    }
    if ((auVar2 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      sVar10 = uVar5 * cpml_thickness * lVar8 * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hy_x[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hz_x[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ey_x[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ez_x[1] = pvVar6;
    }
    if ((bVar4 & border_cpml) != 0) {
      sVar10 = uVar5 * cpml_thickness * uVar16 * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hx_y[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hz_y[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ex_y[0] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ez_y[0] = pvVar6;
    }
    if ((bVar3 & border_cpml) != 0) {
      sVar10 = uVar5 * cpml_thickness * uVar16 * 8;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hx_y[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_hz_y[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ex_y[1] = pvVar6;
      pvVar6 = calloc(1,sVar10);
      __return_storage_ptr__->psi_ez_y[1] = pvVar6;
    }
  }
  pfVar7 = (float_type *)calloc(cpml_thickness,8);
  __return_storage_ptr__->bx = pfVar7;
  __return_storage_ptr__->by = pfVar7;
  __return_storage_ptr__->bz = pfVar7;
  pfVar7 = (float_type *)calloc(cpml_thickness,8);
  __return_storage_ptr__->cx = pfVar7;
  __return_storage_ptr__->cy = pfVar7;
  __return_storage_ptr__->cz = pfVar7;
  pvVar6 = (void *)(cpml_thickness - 1);
  dist_from_border = (void *)0x0;
  dVar1 = __return_storage_ptr__->dx;
  while (bVar11 = cpml_thickness != 0, cpml_thickness = cpml_thickness - 1, bVar11) {
    fVar14 = b((uintmax_t)dist_from_border,(uintmax_t)pvVar6,__return_storage_ptr__->dt,
               dVar1 * 5.563250280268093e-11 * 0.1,4.0 / (dVar1 * 376.7303134617706));
    __return_storage_ptr__->bx[cpml_thickness] = fVar14;
    fVar14 = __return_storage_ptr__->dt;
    c(dist_from_border,pvVar6);
    dist_from_border = (void *)((long)dist_from_border + 1);
    __return_storage_ptr__->cx[cpml_thickness] = fVar14;
  }
  auVar12 = vshufpd_avx(auVar17,auVar17,1);
  fprintf(_stderr,"Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n",dVar13,dVar18,dVar18,dVar18,
          auVar17._0_8_,auVar12._0_8_,auVar15._0_8_);
  return __return_storage_ptr__;
}

Assistant:

struct fdtd3D init_fdtd_3D_cpml(float_type domain_size[3], float_type Sc,
                                float_type smallest_wavelength,
                                enum border_condition borders[num_borders_3D],
                                uintmax_t cpml_thickness) {

  float_type dx = smallest_wavelength / float_cst(20.);
  float_type dy = dx;
  float_type dz = dx;
  float_type dt = dx * Sc / c_light;
  float_type sizeXf = ceil(domain_size[0] / dx);
  float_type sizeYf = ceil(domain_size[1] / dy);
  float_type sizeZf = ceil(domain_size[2] / dy);
  uintmax_t sizeX = (uintmax_t)sizeXf;
  uintmax_t sizeY = (uintmax_t)sizeYf;
  uintmax_t sizeZ = (uintmax_t)sizeZf;
  float_type Sc_max = float_cst(1.) / sqrt(float_cst(3.));
  if (Sc > Sc_max)
    fprintf(stderr,
            "The value of Sc is too high, the simulation may be unstable. "
            "Please use a value lesser or equal to %.5f\n",
            Sc_max);

  struct fdtd3D fdtd = {
      .dx = dx,
      .dy = dy,
      .dz = dz,
      .dt = dt,
      .hx = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hy = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hz = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ex = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ey = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ez = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permittivity_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permeability_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .psi_hx_y = {NULL, NULL},
      .psi_hx_z = {NULL, NULL},
      .psi_hy_x = {NULL, NULL},
      .psi_hy_z = {NULL, NULL},
      .psi_hz_x = {NULL, NULL},
      .psi_hz_y = {NULL, NULL},
      .psi_ex_y = {NULL, NULL},
      .psi_ex_z = {NULL, NULL},
      .psi_ey_x = {NULL, NULL},
      .psi_ey_z = {NULL, NULL},
      .psi_ez_x = {NULL, NULL},
      .psi_ez_y = {NULL, NULL},
      .bx = NULL,
      .by = NULL,
      .bz = NULL,
      .cx = NULL,
      .cy = NULL,
      .cz = NULL,
      .cpml_thickness = cpml_thickness,
      .border_condition =
          {
              [border_front] = borders[border_front],
              [border_back] = borders[border_back],
              [border_top] = borders[border_top],
              [border_bottom] = borders[border_bottom],
              [border_right] = borders[border_right],
              [border_left] = borders[border_left],
          },
      .domain_size = {domain_size[0], domain_size[1], domain_size[2]},
      .sizeX = sizeX,
      .sizeY = sizeY,
      .sizeZ = sizeZ,
      .Sc = Sc,
      .num_Jsources = 0,
      .Jsources = NULL,
      .JsourceLocations = NULL,
      .num_Msources = 0,
      .Msources = NULL,
      .MsourceLocations = NULL,
      .time = float_cst(0.),
  };

  if (cpml_thickness > 0 && fdtd.border_condition[border_front] & border_cpml) {
    fdtd.psi_hx_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_back] & border_cpml) {
    fdtd.psi_hx_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 &&
      fdtd.border_condition[border_bottom] & border_cpml) {
    fdtd.psi_hy_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_top] & border_cpml) {
    fdtd.psi_hy_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_left] & border_cpml) {
    fdtd.psi_hx_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_right] & border_cpml) {
    fdtd.psi_hx_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  fdtd.bx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.by = fdtd.bx;
  fdtd.bz = fdtd.bx;
  fdtd.cx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.cy = fdtd.cx;
  fdtd.cz = fdtd.cx;
  float_type alpha_max = float_cst(2.) * M_PI * eps0 * fdtd.dx * float_cst(0.1);
  float_type sigma_max = float_cst(0.8) * (polynomial_taper_order + 1) /
                         (fdtd.dx * sqrt(mu0 / eps0));
  for (uintmax_t d = 0; d < cpml_thickness; ++d) {
    // store from border of domain to interface CPML / simulation medium
    fdtd.bx[cpml_thickness - d - 1] =
        b(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
    fdtd.cx[cpml_thickness - d - 1] =
        c(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
  }

  fprintf(stderr, "Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n", dt, dx, dy, dz,
          sizeXf, sizeYf, sizeZf);

  return fdtd;
}